

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O3

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitTryTable(InternalAnalyzer *this,TryTable *curr)

{
  size_t *psVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  undefined1 auStack_48 [8];
  Name name;
  
  sVar2 = (curr->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
  ;
  if (sVar2 != 0) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      if ((curr->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
          <= uVar4) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::operator[](size_t) const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
                     );
      }
      psVar1 = (size_t *)
               ((long)&(((curr->catchDests).
                         super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data)->
                       super_IString).str._M_len + lVar3);
      auStack_48 = (undefined1  [8])*psVar1;
      name.super_IString.str._M_len = psVar1[1];
      std::
      _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
      ::_M_insert_unique<wasm::Name_const&>
                ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                  *)&this->parent->breakTargets,(Name *)auStack_48);
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (sVar2 != uVar4);
  }
  return;
}

Assistant:

void visitTryTable(TryTable* curr) {
      for (auto name : curr->catchDests) {
        parent.breakTargets.insert(name);
      }
    }